

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

int xmlSchematronUnregisterVariables
              (xmlSchematronValidCtxtPtr vctxt,xmlXPathContextPtr_conflict ctxt,
              xmlSchematronLetPtr_conflict let)

{
  int iVar1;
  xmlSchematronLetPtr_conflict local_28;
  xmlSchematronLetPtr_conflict let_local;
  xmlXPathContextPtr_conflict ctxt_local;
  xmlSchematronValidCtxtPtr vctxt_local;
  
  local_28 = let;
  while( true ) {
    if (local_28 == (xmlSchematronLetPtr_conflict)0x0) {
      return 0;
    }
    iVar1 = xmlXPathRegisterVariableNS(ctxt,local_28->name,(xmlChar *)0x0,(xmlXPathObjectPtr)0x0);
    if (iVar1 != 0) break;
    local_28 = local_28->next;
  }
  xmlSchematronVErr(vctxt,1,"Unregistering a let variable failed\n",(xmlChar *)0x0);
  return -1;
}

Assistant:

static int
xmlSchematronUnregisterVariables(xmlSchematronValidCtxtPtr vctxt,
                                 xmlXPathContextPtr ctxt,
                                 xmlSchematronLetPtr let)
{
    while (let != NULL) {
        if (xmlXPathRegisterVariableNS(ctxt, let->name, NULL, NULL)) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Unregistering a let variable failed\n", NULL);
            return -1;
        }
        let = let->next;
    }
    return 0;
}